

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext *ctx)

{
  FunctionData *function_00;
  SynIdentifier *pSVar1;
  bool bVar2;
  uint uVar3;
  FunctionData **ppFVar4;
  ArgumentData *pAVar5;
  VariableHandle *local_58;
  VariableHandle *curr;
  InplaceStr name;
  ArgumentData *argument;
  uint i_1;
  bool isGeneric;
  bool isStatic;
  FunctionData *function;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Function prototypes");
  for (function._4_4_ = 0; uVar3 = SmallArray<FunctionData_*,_128U>::size(&ctx->ctx->functions),
      function._4_4_ < uVar3; function._4_4_ = function._4_4_ + 1) {
    ppFVar4 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->ctx->functions,function._4_4_);
    function_00 = *ppFVar4;
    bVar2 = ExpressionContext::IsGenericFunction(ctx->ctx,function_00);
    if ((!bVar2) && (function_00->implementation == (FunctionData *)0x0)) {
      bVar2 = false;
      argument._6_1_ = false;
      if ((function_00->scope == ctx->ctx->globalScope) ||
         ((function_00->scope->ownerNamespace != (NamespaceData *)0x0 ||
          (function_00->scope->ownerType != (TypeBase *)0x0)))) {
        if (*(function_00->name->name).begin == '$') {
          bVar2 = true;
        }
        else if ((function_00->isHidden & 1U) == 0) {
          argument._6_1_ = ExpressionContext::IsGenericInstance(ctx->ctx,function_00);
        }
        else {
          bVar2 = true;
        }
      }
      else {
        bVar2 = true;
      }
      if ((!bVar2) || (function_00->importModule == (ModuleData *)0x0)) {
        if (bVar2) {
          Print(ctx,"static ");
        }
        else if (argument._6_1_ != false) {
          Print(ctx,"template<int I> ");
        }
        TranslateTypeName(ctx,function_00->type->returnType);
        Print(ctx," ");
        TranslateFunctionName(ctx,function_00);
        Print(ctx,"(");
        if (function_00->importModule == (ModuleData *)0x0) {
          for (local_58 = (function_00->argumentVariables).head; local_58 != (VariableHandle *)0x0;
              local_58 = local_58->next) {
            TranslateTypeName(ctx,local_58->variable->type);
            Print(ctx," ");
            TranslateVariableName(ctx,local_58->variable);
            Print(ctx,", ");
          }
          TranslateTypeName(ctx,function_00->contextArgument->type);
          Print(ctx," ");
          TranslateVariableName(ctx,function_00->contextArgument);
        }
        else {
          for (argument._0_4_ = 0;
              uVar3 = SmallArray<ArgumentData,_4U>::size(&function_00->arguments),
              (uint)argument < uVar3; argument._0_4_ = (uint)argument + 1) {
            pAVar5 = SmallArray<ArgumentData,_4U>::operator[]
                               (&function_00->arguments,(uint)argument);
            TranslateTypeName(ctx,pAVar5->type);
            Print(ctx," ");
            pSVar1 = pAVar5->name;
            InplaceStr::InplaceStr((InplaceStr *)&name.end,"this");
            bVar2 = InplaceStr::operator==(&pSVar1->name,(InplaceStr *)&name.end);
            if (bVar2) {
              Print(ctx,"__context");
            }
            else if (*(pAVar5->name->name).begin == '$') {
              InplaceStr::InplaceStr
                        ((InplaceStr *)&curr,(pAVar5->name->name).begin + 1,(pAVar5->name->name).end
                        );
              Print(ctx,"__%.*s",(ulong)(uint)((int)name.begin - (int)curr),curr);
            }
            else {
              Print(ctx,"%.*s",
                    (ulong)(uint)((int)(pAVar5->name->name).end - (int)(pAVar5->name->name).begin),
                    (pAVar5->name->name).begin);
            }
            Print(ctx,", ");
          }
          TranslateTypeName(ctx,function_00->contextType);
          Print(ctx," __context");
        }
        Print(ctx,");");
        PrintLine(ctx);
      }
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Function prototypes");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		if(function->implementation)
			continue;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic && function->importModule)
			continue;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		if(function->importModule)
		{
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &argument = function->arguments[i];

				TranslateTypeName(ctx, argument.type);
				Print(ctx, " ");

				if(argument.name->name == InplaceStr("this"))
				{
					Print(ctx, "__context");
				}
				else if(*argument.name->name.begin == '$')
				{
					InplaceStr name = InplaceStr(argument.name->name.begin + 1, argument.name->name.end);

					Print(ctx, "__%.*s", FMT_ISTR(name));
				}
				else
				{
					Print(ctx, "%.*s", FMT_ISTR(argument.name->name));
				}

				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextType);
			Print(ctx, " __context");
		}
		else
		{
			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				TranslateTypeName(ctx, curr->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextArgument->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, function->contextArgument);
		}

		Print(ctx, ");");
		PrintLine(ctx);
	}

	PrintLine(ctx);
}